

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

ssize_t tnt_object_vformat(tnt_stream *s,char *fmt,__va_list_tag *vl)

{
  uint uVar1;
  uint32_t len_00;
  char *__s;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  size_t sVar5;
  uint *local_208;
  int *local_1f0;
  uint *local_1d8;
  int *local_1c0;
  uint64_t *local_1a8;
  uint64_t *local_190;
  uint64_t *local_178;
  uint64_t *local_160;
  int *local_148;
  double *local_130;
  double *local_110;
  undefined8 *local_f0;
  uint32_t *local_d8;
  undefined8 *local_c0;
  uint *local_a8;
  int *local_90;
  _Bool v_2;
  double v_1;
  float v;
  char *str_1;
  uint32_t len_1;
  uint32_t len;
  char *str;
  uint64_t uStack_48;
  int int_status;
  int64_t int_value;
  char *f;
  ssize_t rv;
  ssize_t result;
  __va_list_tag *vl_local;
  char *fmt_local;
  tnt_stream *s_local;
  
  iVar2 = tnt_object_type(s,TNT_SBO_PACKED);
  if (iVar2 == -1) {
    s_local = (tnt_stream *)0xffffffffffffffff;
  }
  else {
    rv = 0;
    for (int_value = (int64_t)fmt; *(char *)int_value != '\0'; int_value = int_value + 1) {
      if (*(char *)int_value == '[') {
        sVar3 = tnt_object_add_array(s,0);
        if (sVar3 == -1) {
          return -1;
        }
        rv = sVar3 + rv;
      }
      else if (*(char *)int_value == '{') {
        sVar3 = tnt_object_add_map(s,0);
        if (sVar3 == -1) {
          return -1;
        }
        rv = sVar3 + rv;
      }
      else if ((*(char *)int_value == ']') || (*(char *)int_value == '}')) {
        sVar3 = tnt_object_container_close(s);
        if (sVar3 == -1) {
          return -1;
        }
        rv = sVar3 + rv;
      }
      else if (*(char *)int_value == '%') {
        pcVar4 = (char *)(int_value + 1);
        if (*pcVar4 == '\0') {
          __assert_fail("f[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/tnt/tnt_object.c"
                        ,0x156,
                        "ssize_t tnt_object_vformat(struct tnt_stream *, const char *, struct __va_list_tag *)"
                       );
        }
        uStack_48 = 0;
        str._4_4_ = 0;
        if ((*pcVar4 == 'd') || (*pcVar4 == 'i')) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_90 = (int *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_90 = (int *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_90 + 2;
          }
          uStack_48 = (uint64_t)*local_90;
          str._4_4_ = 1;
          int_value = (int64_t)pcVar4;
        }
        else if (*pcVar4 == 'u') {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_a8 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_a8 = (uint *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_a8 + 2;
          }
          uStack_48 = (uint64_t)*local_a8;
          str._4_4_ = 2;
          int_value = (int64_t)pcVar4;
        }
        else if (*pcVar4 == 's') {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_c0 = (undefined8 *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_c0 = (undefined8 *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_c0 + 1;
          }
          __s = (char *)*local_c0;
          sVar5 = strlen(__s);
          sVar3 = tnt_object_add_str(s,__s,(uint32_t)sVar5);
          if (sVar3 == -1) {
            return -1;
          }
          rv = sVar3 + rv;
          int_value = (int64_t)pcVar4;
        }
        else if (((*pcVar4 == '.') && (*(char *)(int_value + 2) == '*')) &&
                (*(char *)(int_value + 3) == 's')) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_d8 = (uint32_t *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_d8 = (uint32_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_d8 + 2;
          }
          len_00 = *local_d8;
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_f0 = (undefined8 *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_f0 = (undefined8 *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_f0 + 1;
          }
          sVar3 = tnt_object_add_str(s,(char *)*local_f0,len_00);
          if (sVar3 == -1) {
            return -1;
          }
          rv = sVar3 + rv;
          int_value = int_value + 3;
        }
        else if (*pcVar4 == 'f') {
          uVar1 = vl->fp_offset;
          if (uVar1 < 0xa1) {
            local_110 = (double *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->fp_offset = uVar1 + 0x10;
          }
          else {
            local_110 = (double *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_110 + 1;
          }
          sVar3 = tnt_object_add_float(s,(float)*local_110);
          if (sVar3 == -1) {
            return -1;
          }
          rv = sVar3 + rv;
          int_value = (int64_t)pcVar4;
        }
        else if ((*pcVar4 == 'l') && (*(char *)(int_value + 2) == 'f')) {
          uVar1 = vl->fp_offset;
          if (uVar1 < 0xa1) {
            local_130 = (double *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->fp_offset = uVar1 + 0x10;
          }
          else {
            local_130 = (double *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_130 + 1;
          }
          sVar3 = tnt_object_add_double(s,*local_130);
          if (sVar3 == -1) {
            return -1;
          }
          rv = sVar3 + rv;
          int_value = int_value + 2;
        }
        else if (*pcVar4 == 'b') {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_148 = (int *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_148 = (int *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_148 + 2;
          }
          sVar3 = tnt_object_add_bool(s,*local_148 != 0);
          if (sVar3 == -1) {
            return -1;
          }
          rv = sVar3 + rv;
          int_value = (int64_t)pcVar4;
        }
        else if ((*pcVar4 == 'l') &&
                ((*(char *)(int_value + 2) == 'd' || (*(char *)(int_value + 2) == 'i')))) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_160 = (uint64_t *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_160 = (uint64_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_160 + 1;
          }
          uStack_48 = *local_160;
          str._4_4_ = 1;
          int_value = int_value + 2;
        }
        else if ((*pcVar4 == 'l') && (*(char *)(int_value + 2) == 'u')) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_178 = (uint64_t *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_178 = (uint64_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_178 + 1;
          }
          uStack_48 = *local_178;
          str._4_4_ = 2;
          int_value = int_value + 2;
        }
        else if (((*pcVar4 == 'l') && (*(char *)(int_value + 2) == 'l')) &&
                ((*(char *)(int_value + 3) == 'd' || (*(char *)(int_value + 3) == 'i')))) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_190 = (uint64_t *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_190 = (uint64_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_190 + 1;
          }
          uStack_48 = *local_190;
          str._4_4_ = 1;
          int_value = int_value + 3;
        }
        else if (((*pcVar4 == 'l') && (*(char *)(int_value + 2) == 'l')) &&
                (*(char *)(int_value + 3) == 'u')) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_1a8 = (uint64_t *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_1a8 = (uint64_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_1a8 + 1;
          }
          uStack_48 = *local_1a8;
          str._4_4_ = 2;
          int_value = int_value + 3;
        }
        else if ((*pcVar4 == 'h') &&
                ((*(char *)(int_value + 2) == 'd' || (*(char *)(int_value + 2) == 'i')))) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_1c0 = (int *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_1c0 = (int *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_1c0 + 2;
          }
          uStack_48 = (uint64_t)*local_1c0;
          str._4_4_ = 1;
          int_value = int_value + 2;
        }
        else if ((*pcVar4 == 'h') && (*(char *)(int_value + 2) == 'u')) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_1d8 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_1d8 = (uint *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_1d8 + 2;
          }
          uStack_48 = (uint64_t)*local_1d8;
          str._4_4_ = 2;
          int_value = int_value + 2;
        }
        else if (((*pcVar4 == 'h') && (*(char *)(int_value + 2) == 'h')) &&
                ((*(char *)(int_value + 3) == 'd' || (*(char *)(int_value + 3) == 'i')))) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_1f0 = (int *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_1f0 = (int *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_1f0 + 2;
          }
          uStack_48 = (uint64_t)*local_1f0;
          str._4_4_ = 1;
          int_value = int_value + 3;
        }
        else if (((*pcVar4 == 'h') && (*(char *)(int_value + 2) == 'h')) &&
                (*(char *)(int_value + 3) == 'u')) {
          uVar1 = vl->gp_offset;
          if (uVar1 < 0x29) {
            local_208 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
            vl->gp_offset = uVar1 + 8;
          }
          else {
            local_208 = (uint *)vl->overflow_arg_area;
            vl->overflow_arg_area = local_208 + 2;
          }
          uStack_48 = (uint64_t)*local_208;
          str._4_4_ = 2;
          int_value = int_value + 3;
        }
        else {
          int_value = (int64_t)pcVar4;
          if (*pcVar4 != '%') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/tnt/tnt_object.c"
                          ,0x1a3,
                          "ssize_t tnt_object_vformat(struct tnt_stream *, const char *, struct __va_list_tag *)"
                         );
          }
        }
        if (str._4_4_ == 1) {
          sVar3 = tnt_object_add_int(s,uStack_48);
          if (sVar3 == -1) {
            return -1;
          }
          rv = sVar3 + rv;
        }
        else if (str._4_4_ == 2) {
          sVar3 = tnt_object_add_uint(s,uStack_48);
          if (sVar3 == -1) {
            return -1;
          }
          rv = sVar3 + rv;
        }
      }
      else if (((*(char *)int_value == 'N') && (*(char *)(int_value + 1) == 'I')) &&
              (*(char *)(int_value + 2) == 'L')) {
        sVar3 = tnt_object_add_nil(s);
        if (sVar3 == -1) {
          return -1;
        }
        rv = sVar3 + rv;
        int_value = int_value + 2;
      }
    }
    s_local = (tnt_stream *)rv;
  }
  return (ssize_t)s_local;
}

Assistant:

ssize_t tnt_object_vformat(struct tnt_stream *s, const char *fmt, va_list vl)
{
	if (tnt_object_type(s, TNT_SBO_PACKED) == -1)
		return -1;
	ssize_t result = 0, rv = 0;

	for (const char *f = fmt; *f; f++) {
		if (f[0] == '[') {
			if ((rv = tnt_object_add_array(s, 0)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == '{') {
			if ((rv = tnt_object_add_map(s, 0)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == ']' || f[0] == '}') {
			if ((rv = tnt_object_container_close(s)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == '%') {
			f++;
			assert(f[0]);
			int64_t int_value = 0;
			int int_status = 0; /* 1 - signed, 2 - unsigned */

			if (f[0] == 'd' || f[0] == 'i') {
				int_value = va_arg(vl, int);
				int_status = 1;
			} else if (f[0] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
			} else if (f[0] == 's') {
				const char *str = va_arg(vl, const char *);
				uint32_t len = (uint32_t)strlen(str);
				if ((rv = tnt_object_add_str(s, str, len)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 's') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *str = va_arg(vl, const char *);
				if ((rv = tnt_object_add_str(s, str, len)) == -1)
					return -1;
				result += rv;
				f += 2;
			} else if (f[0] == 'f') {
				float v = (float)va_arg(vl, double);
				if ((rv = tnt_object_add_float(s, v)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == 'l' && f[1] == 'f') {
				double v = va_arg(vl, double);
				if ((rv = tnt_object_add_double(s, v)) == -1)
					return -1;
				result += rv;
				f++;
			} else if (f[0] == 'b') {
				bool v = (bool)va_arg(vl, int);
				if ((rv = tnt_object_add_bool(s, v)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == 'l'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, long);
				int_status = 1;
				f++;
			} else if (f[0] == 'l' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned long);
				int_status = 2;
				f++;
			} else if (f[0] == 'l' && f[1] == 'l'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, long long);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'l' && f[1] == 'l' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned long long);
				int_status = 2;
				f += 2;
			} else if (f[0] == 'h'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f++;
			} else if (f[0] == 'h' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f++;
			} else if (f[0] == 'h' && f[1] == 'h'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'h' && f[1] == 'h' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f += 2;
			} else if (f[0] != '%') {
				/* unexpected format specifier */
				assert(false);
			}

			if (int_status == 1) {
				rv = tnt_object_add_int(s, int_value);
				if (rv == -1)
					return -1;
				result += rv;
			} else if (int_status == 2) {
				rv = tnt_object_add_uint(s, int_value);
				if (rv == -1)
					return -1;
				result += rv;
			}
		} else if (f[0] == 'N' && f[1] == 'I' && f[2] == 'L') {
			if ((rv = tnt_object_add_nil(s)) == -1)
				return -1;
			result += rv;
			f += 2;
		}
	}
	return result;
}